

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_VectorUnlimString_Test::TestBody(TApp_VectorUnlimString_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  Option *this_00;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  AssertHelper local_380;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_4;
  Message local_358;
  allocator local_349;
  string local_348;
  size_t local_328;
  unsigned_long local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  iterator local_278;
  size_type local_270;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_2;
  Message local_240;
  allocator local_231;
  string local_230;
  size_t local_210;
  unsigned_long local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  iterator local_160;
  size_type local_158;
  AssertHelper local_150;
  Message local_148;
  int local_140 [2];
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  string local_120;
  allocator local_f9;
  string local_f8;
  Option *local_d8;
  Option *opt;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  answer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvec;
  TApp_VectorUnlimString_Test *this_local;
  
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&answer.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  opt._1_1_ = 1;
  local_b8 = &local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"mystring",&local_b9);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"mystring2",(allocator *)((long)&opt + 3));
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"mystring3",(allocator *)((long)&opt + 2));
  opt._1_1_ = 0;
  local_50 = &local_b0;
  local_48 = 3;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&opt);
  __l_01._M_len = local_48;
  __l_01._M_array = local_50;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40,__l_01,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&opt);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&opt);
  local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
  do {
    local_3c8 = local_3c8 + -1;
    std::__cxx11::string::~string((string *)local_3c8);
  } while (local_3c8 != &local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"-s,--string",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  this_00 = CLI::App::add_option<std::__cxx11::string>
                      (&(this->super_TApp).app,&local_f8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&answer.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_140[1] = 0xffffffff;
  local_d8 = this_00;
  local_140[0] = CLI::Option::get_expected(this_00);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_138,"-1","opt->get_expected()",local_140 + 1,local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3a7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  gtest_ar_1.message_.ptr_._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e0,"--string",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,"mystring",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,"mystring2",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"mystring3",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 4));
  gtest_ar_1.message_.ptr_._3_1_ = 0;
  local_160 = &local_1e0;
  local_158 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_160;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_478 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160;
  do {
    local_478 = local_478 + -1;
    std::__cxx11::string::~string((string *)local_478);
  } while (local_478 != &local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_208 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"--string",&local_231);
  local_210 = CLI::App::count(&(this->super_TApp).app,&local_230);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_200,"(size_t)3","app.count(\"--string\")",&local_208,
             &local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3ab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_258,"answer","strvec",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&answer.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3ac,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_3.message_.ptr_._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f8,"-s",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d8,"mystring",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2b8,"mystring2",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_298,"mystring3",(allocator *)((long)&gtest_ar_3.message_.ptr_ + 4));
  gtest_ar_3.message_.ptr_._3_1_ = 0;
  local_278 = &local_2f8;
  local_270 = 4;
  __l._M_len = 4;
  __l._M_array = local_278;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278;
  do {
    local_530 = local_530 + -1;
    std::__cxx11::string::~string((string *)local_530);
  } while (local_530 != &local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_320 = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"--string",&local_349);
  local_328 = CLI::App::count(&(this->super_TApp).app,&local_348);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_318,"(size_t)3","app.count(\"--string\")",&local_320,
             &local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3b1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_370,"answer","strvec",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&answer.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3b2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&answer.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(TApp, VectorUnlimString) {
    std::vector<std::string> strvec;
    std::vector<std::string> answer{"mystring", "mystring2", "mystring3"};

    CLI::Option *opt = app.add_option("-s,--string", strvec);
    EXPECT_EQ(-1, opt->get_expected());

    args = {"--string", "mystring", "mystring2", "mystring3"};
    run();
    EXPECT_EQ((size_t)3, app.count("--string"));
    EXPECT_EQ(answer, strvec);

    app.reset();
    args = {"-s", "mystring", "mystring2", "mystring3"};
    run();
    EXPECT_EQ((size_t)3, app.count("--string"));
    EXPECT_EQ(answer, strvec);
}